

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void storeMapping(uint32_t codepoint,uint32_t *mapping,int32_t length,UStringPrepType type,
                 UErrorCode *status)

{
  UBool UVar1;
  short sVar2;
  uint32_t uVar3;
  void *pvVar4;
  undefined8 *value;
  short sVar5;
  uint uVar6;
  int iVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  
  if (hashTable == (UHashtable *)0x0) {
    hashTable = uhash_open_63(hashEntry,compareEntries,(undefined1 *)0x0,status);
    uhash_setValueDeleter_63(hashTable,valueDeleter);
  }
  uVar3 = utrie_get32_63(sprepTrie,codepoint,(UBool *)0x0);
  if ((uVar3 != 0) && (uVar3 != 0xfff2)) goto LAB_0010a345;
  if (length < 1) {
    sVar10 = 0;
  }
  else {
    sVar2 = 0;
    sVar10 = 0;
    do {
      sVar10 = (sVar10 - (ushort)(mapping[sVar2] < 0x10000)) + 2;
      sVar2 = sVar2 + 1;
    } while (sVar2 < length);
  }
  if (sVar10 == 1) {
LAB_0010a20b:
    if (((int)(short)(codepoint - *mapping) + 0x2000U < 0x4000) &&
       (uVar6 = (codepoint - *mapping) * 0x10000 >> 0xe & 0xfffc, uVar6 < 0xfff0)) {
      UVar1 = utrie_set32_63(sprepTrie,codepoint,uVar6);
      if (UVar1 != '\0') {
        return;
      }
      storeMapping_cold_1();
    }
  }
  else if (sVar10 == 0) {
    UVar1 = utrie_set32_63(sprepTrie,codepoint,0xfefc);
    if (UVar1 != '\0') {
      return;
    }
    storeMapping_cold_2();
    goto LAB_0010a20b;
  }
  iVar7 = (int)sVar10;
  pvVar4 = uprv_calloc_63((long)(iVar7 + 1),2);
  if (0 < length) {
    sVar5 = 0;
    sVar2 = 0;
    do {
      uVar6 = mapping[sVar2];
      if (uVar6 < 0x10000) {
        sVar9 = 1;
        sVar8 = sVar5;
      }
      else {
        sVar8 = sVar5 + 1;
        *(short *)((long)pvVar4 + (long)sVar5 * 2) = (short)(uVar6 >> 10) + -0x2840;
        uVar6 = uVar6 & 0x3ff | 0xdc00;
        sVar9 = 2;
      }
      sVar5 = sVar9 + sVar5;
      *(short *)((long)pvVar4 + (long)sVar8 * 2) = (short)uVar6;
      sVar2 = sVar2 + 1;
    } while (sVar2 < length);
  }
  value = (undefined8 *)uprv_malloc_63(0x10);
  *value = pvVar4;
  *(UStringPrepType *)((long)value + 0xc) = type;
  *(short *)(value + 1) = sVar10;
  if (3 < sVar10) {
    mappingDataCapacity = mappingDataCapacity + 1;
  }
  if (maxLength < iVar7) {
    maxLength = iVar7;
  }
  uhash_iput_63(hashTable,codepoint,value,status);
  mappingDataCapacity = mappingDataCapacity + iVar7;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  storeMapping_cold_3();
LAB_0010a345:
  storeMapping_cold_4();
  return;
}

Assistant:

extern void
storeMapping(uint32_t codepoint, uint32_t* mapping,int32_t length,
             UStringPrepType type, UErrorCode* status){
    
 
    UChar* map = NULL;
    int16_t adjustedLen=0, i, j;
    uint16_t trieWord = 0;
    ValueStruct *value = NULL;
    uint32_t savedTrieWord = 0;

    /* initialize the hashtable */
    if(hashTable==NULL){
        hashTable = uhash_open(hashEntry, compareEntries, NULL, status);
        uhash_setValueDeleter(hashTable, valueDeleter);
    }
    
    /* figure out if the code point has type already stored */
    savedTrieWord= utrie_get32(sprepTrie,codepoint,NULL);
    if(savedTrieWord!=0){
        if((savedTrieWord- _SPREP_TYPE_THRESHOLD) == USPREP_PROHIBITED){
            /* turn on the first bit in trie word */
            trieWord += 0x01;
        }else{
            /* 
             * the codepoint has value something other than prohibited
             * and a mapping .. error! 
             */
            fprintf(stderr,"Type for codepoint \\U%08X already set!.\n", (int)codepoint);
            exit(U_ILLEGAL_ARGUMENT_ERROR); 
        } 
    }

    /* figure out the real length */ 
    for(i=0; i<length; i++){
        adjustedLen += U16_LENGTH(mapping[i]);
    }

    if(adjustedLen == 0){
        trieWord = (uint16_t)(_SPREP_MAX_INDEX_VALUE << 2);
        /* make sure that the value of trieWord is less than the threshold */
        if(trieWord < _SPREP_TYPE_THRESHOLD){   
            /* now set the value in the trie */
            if(!utrie_set32(sprepTrie,codepoint,trieWord)){
                fprintf(stderr,"Could not set the value for code point.\n");
                exit(U_ILLEGAL_ARGUMENT_ERROR);   
            }
            /* value is set so just return */
            return;
        }else{
            fprintf(stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",_SPREP_TYPE_THRESHOLD);
            exit(U_ILLEGAL_CHAR_FOUND);
        }
    }

    if(adjustedLen == 1){
        /* calculate the delta */
        int16_t delta = (int16_t)((int32_t)codepoint - (int16_t) mapping[0]);
        if(delta >= SPREP_DELTA_RANGE_NEGATIVE_LIMIT && delta <= SPREP_DELTA_RANGE_POSITIVE_LIMIT){

            trieWord = delta << 2;


            /* make sure that the second bit is OFF */
            if((trieWord & 0x02) != 0 ){
                fprintf(stderr,"The second bit in the trie word is not zero while storing a delta.\n");
                exit(U_INTERNAL_PROGRAM_ERROR);
            }
            /* make sure that the value of trieWord is less than the threshold */
            if(trieWord < _SPREP_TYPE_THRESHOLD){   
                /* now set the value in the trie */
                if(!utrie_set32(sprepTrie,codepoint,trieWord)){
                    fprintf(stderr,"Could not set the value for code point.\n");
                    exit(U_ILLEGAL_ARGUMENT_ERROR);   
                }
                /* value is set so just return */
                return;
            }
        }
        /* 
         * if the delta is not in the given range or if the trieWord is larger than the threshold
         * just fall through for storing the mapping in the mapping table
         */
    }

    map = (UChar*) uprv_calloc(adjustedLen + 1, U_SIZEOF_UCHAR);
    
    for (i=0, j=0; i<length; i++) {
        U16_APPEND_UNSAFE(map, j, mapping[i]);
    }
    
    value = (ValueStruct*) uprv_malloc(sizeof(ValueStruct));
    value->mapping = map;
    value->type    = type;
    value->length  = adjustedLen;
    if(value->length > _SPREP_MAX_INDEX_TOP_LENGTH){
        mappingDataCapacity++;
    }
    if(maxLength < value->length){
        maxLength = value->length;
    }
    uhash_iput(hashTable,codepoint,value,status);
    mappingDataCapacity += adjustedLen;

    if(U_FAILURE(*status)){
        fprintf(stderr, "Failed to put entries into the hastable. Error: %s\n", u_errorName(*status));
        exit(*status);
    }
}